

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicswidget.cpp
# Opt level: O1

void QGraphicsWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 *puVar1;
  ColorGroup CVar2;
  uint uVar3;
  LayoutDirection direction;
  long *plVar4;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 *paVar5;
  QPalettePrivate *pQVar6;
  undefined8 *puVar7;
  QPalette *palette;
  QGraphicsWidgetPrivate *pQVar8;
  QArrayData *pQVar9;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 aVar10;
  long lVar11;
  int *piVar12;
  undefined8 uVar13;
  int iVar14;
  undefined8 uVar15;
  QPalette *pQVar16;
  long in_FS_OFFSET;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  QSizeF QVar21;
  QPointF QVar22;
  QFont fnt;
  undefined1 local_58 [16];
  QPalettePrivate *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      iVar14 = close((QGraphicsWidget *)_o,_c);
      if ((undefined1 *)*_a != (undefined1 *)0x0) {
        *(char *)*_a = (char)iVar14;
      }
    }
    else {
      if (_id == 1) {
        iVar14 = 1;
      }
      else {
        if (_id != 0) goto LAB_0064c40e;
        iVar14 = 0;
      }
      QMetaObject::activate(_o,&staticMetaObject,iVar14,(void **)0x0);
    }
LAB_0064c40e:
    if (_c == ReadProperty) goto switchD_0064c3c5_caseD_1;
    if (_c == WriteProperty) goto switchD_0064c3c5_caseD_2;
    if (_c == IndexOfMethod) goto switchD_0064c3c5_caseD_5;
    goto switchD_0064c3c5_caseD_3;
  case ReadProperty:
switchD_0064c3c5_caseD_1:
    if (0xd < (uint)_id) goto LAB_0064c660;
    break;
  case WriteProperty:
    goto switchD_0064c3c5_caseD_2;
  default:
    goto switchD_0064c3c5_caseD_3;
  case IndexOfMethod:
switchD_0064c3c5_caseD_5:
    plVar4 = (long *)_a[1];
    if (((code *)*plVar4 == geometryChanged) && (plVar4[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto LAB_0064c7a3;
    }
    if (((code *)*plVar4 == layoutChanged) && (plVar4[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto LAB_0064c7a3;
    }
    if (_c == WriteProperty) goto switchD_0064c3c5_caseD_2;
    if (_c == ReadProperty) goto switchD_0064c3c5_caseD_1;
    goto switchD_0064c3c5_caseD_3;
  }
  paVar5 = (anon_union_4_2_313b0b05_for_QSizePolicy_1 *)*_a;
  switch(_id) {
  case 0:
    QPalette::QPalette((QPalette *)local_58,(QPalette *)(*(long *)(_o + 0x18) + 0x188));
    uVar3 = paVar5[2].data;
    paVar5[2].data = local_58._8_4_;
    local_58._8_4_ = uVar3;
    pQVar6 = *(QPalettePrivate **)paVar5;
    *(undefined8 *)paVar5 = local_58._0_8_;
    local_58._0_8_ = pQVar6;
    QPalette::~QPalette((QPalette *)local_58);
    break;
  case 1:
    lVar11 = *(long *)(_o + 0x18);
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFont::QFont((QFont *)local_58,(QFont *)(lVar11 + 0x1a0));
    CVar2 = *(ColorGroup *)(lVar11 + 0x1b0);
    pQVar6 = *(QPalettePrivate **)paVar5;
    *(undefined8 *)paVar5 = local_58._0_8_;
    uVar3 = paVar5[2].data;
    paVar5[2].data = CVar2 | local_58._8_4_;
    local_58._8_8_ = CONCAT44(SUB84(local_58._8_8_,4),uVar3);
    local_58._0_8_ = pQVar6;
    QFont::~QFont((QFont *)local_58);
    break;
  case 2:
    aVar10.data = *(uint *)(*(long *)(_o + 0x18) + 0x1b4) >> 1 & 1;
    goto LAB_0064c65c;
  case 3:
    QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(_o + 0x20));
    *(QPalettePrivate **)paVar5 = local_48;
    *(undefined8 *)(paVar5 + 2) = uStack_40;
    break;
  case 4:
    QVar21 = QGraphicsLayoutItem::minimumSize((QGraphicsLayoutItem *)(_o + 0x20));
    uVar19 = QVar21.ht._0_4_;
    uVar20 = QVar21.ht._4_4_;
    uVar17 = QVar21.wd._0_4_;
    uVar18 = QVar21.wd._4_4_;
    goto LAB_0064c614;
  case 5:
    QVar21 = QGraphicsLayoutItem::preferredSize((QGraphicsLayoutItem *)(_o + 0x20));
    uVar19 = QVar21.ht._0_4_;
    uVar20 = QVar21.ht._4_4_;
    uVar17 = QVar21.wd._0_4_;
    uVar18 = QVar21.wd._4_4_;
    goto LAB_0064c614;
  case 6:
    QVar21 = QGraphicsLayoutItem::maximumSize((QGraphicsLayoutItem *)(_o + 0x20));
    uVar19 = QVar21.ht._0_4_;
    uVar20 = QVar21.ht._4_4_;
    uVar17 = QVar21.wd._0_4_;
    uVar18 = QVar21.wd._4_4_;
LAB_0064c614:
    *(ulong *)paVar5 = CONCAT44(uVar18,uVar17);
    *(ulong *)(paVar5 + 2) = CONCAT44(uVar20,uVar19);
    break;
  case 7:
    aVar10.bits = (Bits)QGraphicsLayoutItem::sizePolicy((QGraphicsLayoutItem *)(_o + 0x20));
    goto LAB_0064c65c;
  case 8:
    aVar10 = *(anon_union_4_2_313b0b05_for_QSizePolicy_1 *)(*(long *)(_o + 0x18) + 0x1b8);
    goto LAB_0064c65c;
  case 9:
    aVar10 = *(anon_union_4_2_313b0b05_for_QSizePolicy_1 *)(*(long *)(_o + 0x18) + 0x1d0);
LAB_0064c65c:
    *paVar5 = aVar10;
    break;
  case 10:
    puVar7 = *(undefined8 **)(*(long *)(_o + 0x18) + 0x1d8);
    if (puVar7 == (undefined8 *)0x0) {
      piVar12 = (int *)0x0;
      uVar13 = 0;
      uVar15 = 0;
    }
    else {
      piVar12 = (int *)*puVar7;
      uVar13 = puVar7[1];
      uVar15 = puVar7[2];
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
    }
    pQVar9 = *(QArrayData **)paVar5;
    *(int **)paVar5 = piVar12;
    *(undefined8 *)(paVar5 + 2) = uVar13;
    *(undefined8 *)(paVar5 + 4) = uVar15;
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar9,2,0x10);
      }
    }
    break;
  case 0xb:
    QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(_o + 0x20));
    *(QPalettePrivate **)(paVar5 + 4) = local_48;
    *(undefined8 *)(paVar5 + 6) = uStack_40;
    *(undefined8 *)paVar5 = local_58._0_8_;
    *(undefined8 *)(paVar5 + 2) = local_58._8_8_;
    break;
  case 0xc:
    *(byte *)paVar5 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 0x18) + 0x1b4) >> 0xd) & 1;
    break;
  case 0xd:
    *(undefined8 *)paVar5 = *(undefined8 *)(*(long *)(_o + 0x18) + 0x180);
  }
LAB_0064c660:
  if (_c != WriteProperty) goto switchD_0064c3c5_caseD_3;
switchD_0064c3c5_caseD_2:
  if (0xd < (uint)_id) goto switchD_0064c3c5_caseD_3;
  palette = (QPalette *)*_a;
  switch(_id) {
  case 0:
    setPalette((QGraphicsWidget *)_o,palette);
    break;
  case 1:
    setFont((QGraphicsWidget *)_o,(QFont *)palette);
    break;
  case 2:
    direction = *(LayoutDirection *)&palette->d;
    pQVar8 = *(QGraphicsWidgetPrivate **)(_o + 0x18);
    puVar1 = &pQVar8->field_0x1b4;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 1;
    QGraphicsWidgetPrivate::setLayoutDirection_helper(pQVar8,direction);
    break;
  case 3:
    QVar22 = QGraphicsItem::pos((QGraphicsItem *)(_o + 0x10));
    pQVar16 = (QPalette *)local_58;
    local_58._0_8_ = QVar22.xp;
    local_58._8_8_ = QVar22.yp;
    local_48 = palette->d;
    uStack_40 = *(undefined8 *)&palette->currentGroup;
    lVar11 = *(long *)_o;
    goto LAB_0064c714;
  case 4:
    QGraphicsLayoutItem::setMinimumSize((QGraphicsLayoutItem *)(_o + 0x20),(QSizeF *)palette);
    break;
  case 5:
    QGraphicsLayoutItem::setPreferredSize((QGraphicsLayoutItem *)(_o + 0x20),(QSizeF *)palette);
    break;
  case 6:
    QGraphicsLayoutItem::setMaximumSize((QGraphicsLayoutItem *)(_o + 0x20),(QSizeF *)palette);
    break;
  case 7:
    QGraphicsLayoutItem::setSizePolicy((QGraphicsLayoutItem *)(_o + 0x20),(QSizePolicy *)palette);
    break;
  case 8:
    setFocusPolicy((QGraphicsWidget *)_o,*(FocusPolicy *)&palette->d);
    break;
  case 9:
    setWindowFlags((QGraphicsWidget *)_o,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)
                   *(QFlagsStorageHelper<Qt::WindowType,_4> *)&palette->d);
    break;
  case 10:
    pQVar8 = *(QGraphicsWidgetPrivate **)(_o + 0x18);
    QGraphicsWidgetPrivate::ensureWindowData(pQVar8);
    QString::operator=(&((pQVar8->windowData)._M_t.
                         super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                         .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>.
                        _M_head_impl)->windowTitle,(QString *)palette);
    break;
  case 0xb:
    lVar11 = *(long *)_o;
    pQVar16 = palette;
LAB_0064c714:
    (**(code **)(lVar11 + 0x60))(_o,pQVar16);
    break;
  case 0xc:
    setAutoFillBackground((QGraphicsWidget *)_o,*(bool *)&palette->d);
    break;
  case 0xd:
    setLayout((QGraphicsWidget *)_o,(QGraphicsLayout *)palette->d);
  }
switchD_0064c3c5_caseD_3:
  if (_id == 2 && _c == ResetProperty) {
    pQVar8 = *(QGraphicsWidgetPrivate **)(_o + 0x18);
    puVar1 = &pQVar8->field_0x1b4;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfffe;
    QGraphicsWidgetPrivate::resolveLayoutDirection(pQVar8);
  }
LAB_0064c7a3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->geometryChanged(); break;
        case 1: _t->layoutChanged(); break;
        case 2: { bool _r = _t->close();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsWidget::*)()>(_a, &QGraphicsWidget::geometryChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsWidget::*)()>(_a, &QGraphicsWidget::layoutChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QPalette*>(_v) = _t->palette(); break;
        case 1: *reinterpret_cast<QFont*>(_v) = _t->font(); break;
        case 2: *reinterpret_cast<Qt::LayoutDirection*>(_v) = _t->layoutDirection(); break;
        case 3: *reinterpret_cast<QSizeF*>(_v) = _t->size(); break;
        case 4: *reinterpret_cast<QSizeF*>(_v) = _t->minimumSize(); break;
        case 5: *reinterpret_cast<QSizeF*>(_v) = _t->preferredSize(); break;
        case 6: *reinterpret_cast<QSizeF*>(_v) = _t->maximumSize(); break;
        case 7: *reinterpret_cast<QSizePolicy*>(_v) = _t->sizePolicy(); break;
        case 8: *reinterpret_cast<Qt::FocusPolicy*>(_v) = _t->focusPolicy(); break;
        case 9: *reinterpret_cast<Qt::WindowFlags*>(_v) = _t->windowFlags(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 11: *reinterpret_cast<QRectF*>(_v) = _t->geometry(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->autoFillBackground(); break;
        case 13: *reinterpret_cast<QGraphicsLayout**>(_v) = _t->layout(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPalette(*reinterpret_cast<QPalette*>(_v)); break;
        case 1: _t->setFont(*reinterpret_cast<QFont*>(_v)); break;
        case 2: _t->setLayoutDirection(*reinterpret_cast<Qt::LayoutDirection*>(_v)); break;
        case 3: _t->resize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 4: _t->setMinimumSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 5: _t->setPreferredSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 6: _t->setMaximumSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 7: _t->setSizePolicy(*reinterpret_cast<QSizePolicy*>(_v)); break;
        case 8: _t->setFocusPolicy(*reinterpret_cast<Qt::FocusPolicy*>(_v)); break;
        case 9: _t->setWindowFlags(*reinterpret_cast<Qt::WindowFlags*>(_v)); break;
        case 10: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 11: _t->setGeometry(*reinterpret_cast<QRectF*>(_v)); break;
        case 12: _t->setAutoFillBackground(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setLayout(*reinterpret_cast<QGraphicsLayout**>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 2: _t->unsetLayoutDirection(); break;
        default: break;
        }
    }
}